

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::lexer::fill_line_buffer(lexer *this,size_t n)

{
  string_t *this_00;
  size_type sVar1;
  uchar *puVar2;
  uchar *__first;
  uchar *__last;
  uchar *puVar3;
  istream *piVar4;
  lexer_char_t *plVar5;
  long lVar6;
  
  this_00 = &this->m_line_buffer;
  sVar1 = (this->m_line_buffer)._M_string_length;
  puVar2 = this->m_content;
  if (sVar1 != 0) {
    if (puVar2 != (uchar *)(this_00->_M_dataplus)._M_p) {
      __assert_fail("m_line_buffer.empty() or m_content == reinterpret_cast<const lexer_char_t*>(m_line_buffer.data())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                    ,0x2a65,
                    "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                   );
    }
    if (this->m_limit != puVar2 + sVar1) {
      __assert_fail("m_line_buffer.empty() or m_limit == m_content + m_line_buffer.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                    ,0x2a69,
                    "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                   );
    }
  }
  __first = this->m_start;
  if (__first < puVar2) {
    __assert_fail("m_content <= m_start",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                  ,0x2a6c,
                  "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  puVar2 = this->m_cursor;
  if (__first <= puVar2) {
    __last = this->m_limit;
    if (__last < puVar2) {
      __assert_fail("m_cursor <= m_limit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                    ,0x2a6e,
                    "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                   );
    }
    puVar3 = this->m_marker;
    if (puVar3 <= __last) {
      piVar4 = this->m_stream;
      if ((piVar4 == (istream *)0x0) ||
         (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 2) != 0)) {
        std::__cxx11::string::assign<unsigned_char_const*,void>((string *)this_00,__first,__last);
        std::__cxx11::string::append((ulong)this_00,'\x01');
        if (n != 0) {
          std::__cxx11::string::append((ulong)this_00,(char)n + -1);
        }
      }
      else {
        std::__cxx11::string::erase((ulong)this_00,0);
        (this->m_line_buffer_tmp)._M_string_length = 0;
        *(this->m_line_buffer_tmp)._M_dataplus._M_p = '\0';
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  (this->m_stream,(string *)&this->m_line_buffer_tmp,'\n');
        std::__cxx11::string::append((string *)this_00);
        std::__cxx11::string::push_back((char)this_00);
      }
      plVar5 = (lexer_char_t *)(this->m_line_buffer)._M_dataplus._M_p;
      this->m_content = plVar5;
      if (plVar5 != (lexer_char_t *)0x0) {
        lVar6 = (long)puVar3 - (long)__first;
        if (puVar3 == (uchar *)0x0) {
          lVar6 = 0;
        }
        this->m_start = plVar5;
        this->m_marker = plVar5 + lVar6;
        this->m_cursor = plVar5 + ((long)puVar2 - (long)__first);
        this->m_limit = plVar5 + (this->m_line_buffer)._M_string_length;
        return;
      }
      __assert_fail("m_content != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                    ,0x2a97,
                    "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                   );
    }
    __assert_fail("m_marker == nullptr or m_marker <= m_limit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                  ,0x2a6f,
                  "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  __assert_fail("m_start <= m_cursor",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                ,0x2a6d,
                "void nlohmann::basic_json<>::lexer::fill_line_buffer(size_t) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
               );
}

Assistant:

void fill_line_buffer(size_t n = 0)
        {
            // if line buffer is used, m_content points to its data
            assert(m_line_buffer.empty()
                   or m_content == reinterpret_cast<const lexer_char_t*>(m_line_buffer.data()));

            // if line buffer is used, m_limit is set past the end of its data
            assert(m_line_buffer.empty()
                   or m_limit == m_content + m_line_buffer.size());

            // pointer relationships
            assert(m_content <= m_start);
            assert(m_start <= m_cursor);
            assert(m_cursor <= m_limit);
            assert(m_marker == nullptr or m_marker  <= m_limit);

            // number of processed characters (p)
            const auto num_processed_chars = static_cast<size_t>(m_start - m_content);
            // offset for m_marker wrt. to m_start
            const auto offset_marker = (m_marker == nullptr) ? 0 : m_marker - m_start;
            // number of unprocessed characters (u)
            const auto offset_cursor = m_cursor - m_start;

            // no stream is used or end of file is reached
            if (m_stream == nullptr or m_stream->eof())
            {
                // m_start may or may not be pointing into m_line_buffer at
                // this point. We trust the standard library to do the right
                // thing. See http://stackoverflow.com/q/28142011/266378
                m_line_buffer.assign(m_start, m_limit);

                // append n characters to make sure that there is sufficient
                // space between m_cursor and m_limit
                m_line_buffer.append(1, '\x00');
                if (n > 0)
                {
                    m_line_buffer.append(n - 1, '\x01');
                }
            }
            else
            {
                // delete processed characters from line buffer
                m_line_buffer.erase(0, num_processed_chars);
                // read next line from input stream
                m_line_buffer_tmp.clear();
                std::getline(*m_stream, m_line_buffer_tmp, '\n');

                // add line with newline symbol to the line buffer
                m_line_buffer += m_line_buffer_tmp;
                m_line_buffer.push_back('\n');
            }

            // set pointers
            m_content = reinterpret_cast<const lexer_char_t*>(m_line_buffer.data());
            assert(m_content != nullptr);
            m_start  = m_content;
            m_marker = m_start + offset_marker;
            m_cursor = m_start + offset_cursor;
            m_limit  = m_start + m_line_buffer.size();
        }